

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O3

void __thiscall
pfederc::StringToken::StringToken
          (StringToken *this,Token *last,TokenType type,Position *pos,string *str)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  
  (this->super_Token).last = last;
  (this->super_Token).type = type;
  uVar2 = *(undefined4 *)((long)&pos->line + 4);
  sVar4 = pos->startIndex;
  uVar3 = *(undefined4 *)((long)&pos->startIndex + 4);
  *(int *)&(this->super_Token).pos.line = (int)pos->line;
  *(undefined4 *)((long)&(this->super_Token).pos.line + 4) = uVar2;
  *(int *)&(this->super_Token).pos.startIndex = (int)sVar4;
  *(undefined4 *)((long)&(this->super_Token).pos.startIndex + 4) = uVar3;
  (this->super_Token).pos.endIndex = pos->endIndex;
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__StringToken_0010cc98;
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->str,pcVar1,pcVar1 + str->_M_string_length);
  return;
}

Assistant:

StringToken::StringToken(Token *last, TokenType type, const Position &pos,
            const std::string &str) noexcept
    : Token(last, type, pos), str(str) {
}